

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_astContinueNode_primitiveCompileIntoBytecode
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t sVar1;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  if (*(long *)(arguments[1] + 0x28) == 0) {
    sysbvm_error("Continue statement in wrong location.");
  }
  sysbvm_functionBytecodeAssembler_jump
            (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),
             *(sysbvm_tuple_t *)(arguments[1] + 0x28));
  sVar1 = sysbvm_functionBytecodeAssembler_addLiteral
                    (context,*(sysbvm_functionBytecodeAssembler_t **)(arguments[1] + 0x10),0x2f);
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_astContinueNode_primitiveCompileIntoBytecode(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    //sysbvm_tuple_t *node = &arguments[0];
    sysbvm_functionBytecodeDirectCompiler_t **compiler = (sysbvm_functionBytecodeDirectCompiler_t **)&arguments[1];
    if(!(*compiler)->continueLabel)
        sysbvm_error("Continue statement in wrong location.");
    sysbvm_functionBytecodeAssembler_jump(context, (*compiler)->assembler, (*compiler)->continueLabel);
     
    return sysbvm_functionBytecodeAssembler_addLiteral(context, (*compiler)->assembler, SYSBVM_VOID_TUPLE);
}